

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

void aom_highbd_quantize_b_adaptive_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  long in_stack_00000018;
  int prescan_add_val_1;
  int factor;
  int coeff_2;
  qm_val_t wt_2;
  long in_stack_00000028;
  int rc_2;
  tran_low_t abs_dqcoeff;
  int dequant;
  qm_val_t iwt;
  long in_stack_00000038;
  int abs_qcoeff;
  int64_t tmp2;
  int64_t tmpw;
  int64_t tmp1;
  int abs_coeff;
  qm_val_t wt_1;
  int coeff_sign;
  int coeff_1;
  int rc_1;
  int first;
  int prescan_add_val;
  int coeff;
  qm_val_t wt;
  int rc;
  int prescan_add [2];
  int eob;
  int non_zero_count;
  int i;
  int nzbins [2];
  int zbins [2];
  int local_68;
  int aiStack_54 [4];
  int local_44;
  int local_40 [4];
  long local_30;
  long local_28;
  long local_20;
  long local_10;
  long local_8;
  
  local_40[2] = (int)*in_RDX + ((1 << ((byte)tmpw & 0x1f)) >> 1) >> ((byte)tmpw & 0x1f);
  local_40[3] = (int)in_RDX[1] + ((1 << ((byte)tmpw & 0x1f)) >> 1) >> ((byte)tmpw & 0x1f);
  local_40[0] = -local_40[2];
  local_40[1] = -local_40[3];
  aiStack_54[3] = (int)in_RSI;
  aiStack_54[2] = -1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(in_stack_00000008,0,in_RSI << 2);
  memset(in_stack_00000010,0,local_10 << 2);
  for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
    aiStack_54[local_44] = *(short *)(in_stack_00000018 + (long)local_44 * 2) * 0x145 + 0x40 >> 7;
  }
  local_44 = (int)local_10;
  while (local_44 = local_44 + -1, -1 < local_44) {
    iVar2 = (int)*(short *)(in_stack_00000028 + (long)local_44 * 2);
    if (in_stack_00000038 == 0) {
      bVar1 = 0x20;
    }
    else {
      bVar1 = *(byte *)(in_stack_00000038 + iVar2);
    }
    iVar3 = *(int *)(local_8 + (long)iVar2 * 4) * (uint)bVar1;
    if ((local_40[(long)(int)(uint)(iVar2 != 0) + 2] * 0x20 + aiStack_54[(int)(uint)(iVar2 != 0)] <=
         iVar3) ||
       (iVar3 <= local_40[(int)(uint)(iVar2 != 0)] * 0x20 - aiStack_54[(int)(uint)(iVar2 != 0)]))
    break;
    aiStack_54[3] = aiStack_54[3] + -1;
  }
  local_68 = -1;
  for (local_44 = 0; local_44 < aiStack_54[3]; local_44 = local_44 + 1) {
    iVar2 = (int)*(short *)(in_stack_00000028 + (long)local_44 * 2);
    uVar5 = *(uint *)(local_8 + (long)iVar2 * 4);
    uVar4 = 0;
    if ((int)uVar5 < 0) {
      uVar4 = 0xffffffff;
    }
    if (in_stack_00000038 == 0) {
      bVar1 = 0x20;
    }
    else {
      bVar1 = *(byte *)(in_stack_00000038 + iVar2);
    }
    iVar3 = (uVar5 ^ uVar4) - uVar4;
    if (local_40[(long)(int)(uint)(iVar2 != 0) + 2] * 0x20 <= (int)(iVar3 * (uint)bVar1)) {
      lVar7 = (long)(iVar3 + ((int)*(short *)(local_20 + (long)(int)(uint)(iVar2 != 0) * 2) +
                              ((1 << ((byte)tmpw & 0x1f)) >> 1) >> ((byte)tmpw & 0x1f))) *
              (ulong)bVar1;
      uVar5 = (uint)(((lVar7 * *(short *)(local_28 + (long)(int)(uint)(iVar2 != 0) * 2) >> 0x10) +
                     lVar7) * (long)*(short *)(local_30 + (long)(int)(uint)(iVar2 != 0) * 2) >>
                    (0x15 - (byte)tmpw & 0x3f));
      *(uint *)((long)in_stack_00000008 + (long)iVar2 * 4) = (uVar5 ^ uVar4) - uVar4;
      if (tmp2 == 0) {
        bVar1 = 0x20;
      }
      else {
        bVar1 = *(byte *)(tmp2 + iVar2);
      }
      *(uint *)((long)in_stack_00000010 + (long)iVar2 * 4) =
           ((int)(uVar5 * ((int)((int)*(short *)(in_stack_00000018 +
                                                (long)(int)(uint)(iVar2 != 0) * 2) * (uint)bVar1 +
                                0x10) >> 5)) >> ((byte)tmpw & 0x1f) ^ uVar4) - uVar4;
      if ((uVar5 != 0) && (aiStack_54[2] = local_44, local_68 == -1)) {
        local_68 = local_44;
      }
    }
  }
  if (((-1 < aiStack_54[2]) && (local_68 == aiStack_54[2])) &&
     ((iVar2 = (int)*(short *)(in_stack_00000028 + (long)aiStack_54[2] * 2),
      *(int *)((long)in_stack_00000008 + (long)iVar2 * 4) == 1 ||
      (*(int *)((long)in_stack_00000008 + (long)iVar2 * 4) == -1)))) {
    if (in_stack_00000038 == 0) {
      bVar1 = 0x20;
    }
    else {
      bVar1 = *(byte *)(in_stack_00000038 + iVar2);
    }
    iVar3 = *(int *)(local_8 + (long)iVar2 * 4) * (uint)bVar1;
    iVar6 = *(short *)(in_stack_00000018 + (long)(int)(uint)(iVar2 != 0) * 2) * 0x20d + 0x40 >> 7;
    if ((iVar3 < local_40[(long)(int)(uint)(iVar2 != 0) + 2] * 0x20 + iVar6) &&
       (local_40[(int)(uint)(iVar2 != 0)] * 0x20 - iVar6 < iVar3)) {
      *(undefined4 *)((long)in_stack_00000008 + (long)iVar2 * 4) = 0;
      *(undefined4 *)((long)in_stack_00000010 + (long)iVar2 * 4) = 0;
      aiStack_54[2] = -1;
    }
  }
  *_factor = (short)aiStack_54[2] + 1;
  return;
}

Assistant:

void aom_highbd_quantize_b_adaptive_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, const int log_scale) {
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  (void)iscan;
  int i, non_zero_count = (int)n_coeffs, eob = -1;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  int prescan_add[2];
  for (i = 0; i < 2; ++i)
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);

  // Pre-scan pass
  for (i = (int)n_coeffs - 1; i >= 0; i--) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;
    const int prescan_add_val = prescan_add[rc != 0];
    if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
        coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val))
      non_zero_count--;
    else
      break;
  }

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif  // SKIP_EOB_FACTOR_ADJUST
  for (i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    if (abs_coeff * wt >= (zbins[rc != 0] << AOM_QM_BITS)) {
      const int64_t tmp1 =
          abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale);
      const int64_t tmpw = tmp1 * wt;
      const int64_t tmp2 = ((tmpw * quant_ptr[rc != 0]) >> 16) + tmpw;
      const int abs_qcoeff = (int)((tmp2 * quant_shift_ptr[rc != 0]) >>
                                   (16 - log_scale + AOM_QM_BITS));
      qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
      const qm_val_t iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
      dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
      if (abs_qcoeff) {
        eob = i;
#if SKIP_EOB_FACTOR_ADJUST
        if (first == -1) first = eob;
#endif  // SKIP_EOB_FACTOR_ADJUST
      }
    }
  }
#if SKIP_EOB_FACTOR_ADJUST
  if (eob >= 0 && first == eob) {
    const int rc = scan[eob];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const int coeff = coeff_ptr[rc] * wt;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
          coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        eob = -1;
      }
    }
  }
#endif  // SKIP_EOB_FACTOR_ADJUST
  *eob_ptr = eob + 1;
}